

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseprov.c
# Opt level: O0

OSSL_ALGORITHM * base_query(void *provctx,int operation_id,int *no_cache)

{
  int *no_cache_local;
  int operation_id_local;
  void *provctx_local;
  OSSL_ALGORITHM *local_8;
  
  *no_cache = 0;
  if (operation_id == 0x14) {
    local_8 = base_encoder;
  }
  else if (operation_id == 0x15) {
    local_8 = base_decoder;
  }
  else if (operation_id == 0x16) {
    local_8 = base_store;
  }
  else {
    local_8 = (OSSL_ALGORITHM *)0x0;
  }
  return local_8;
}

Assistant:

static const OSSL_ALGORITHM *base_query(void *provctx, int operation_id,
                                         int *no_cache)
{
    *no_cache = 0;
    switch (operation_id) {
    case OSSL_OP_ENCODER:
        return base_encoder;
    case OSSL_OP_DECODER:
        return base_decoder;
    case OSSL_OP_STORE:
        return base_store;
    }
    return NULL;
}